

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_image.cpp
# Opt level: O0

void __thiscall
Am_Drawonable_Impl::Draw_Image
          (Am_Drawonable_Impl *this,int left,int top,int width,int height,Am_Image_Array *image,
          int i_left,int i_top,Am_Style *ls,Am_Style *fs,bool draw_monochrome,Am_Draw_Function f)

{
  bool bVar1;
  int iVar2;
  Am_Wrapper *value;
  Am_Image_Array_Data *this_00;
  Pixmap PVar3;
  Pixmap image_00;
  Pixmap mask_3;
  Pixmap mask_2;
  Pixmap mask_1;
  Pixmap mask;
  int depth;
  Pixmap pixmap;
  Am_Image_Array_Data *image_data;
  int local_38;
  int i_height;
  int i_width;
  bool draw_monochrome_local;
  Am_Image_Array *image_local;
  int height_local;
  int width_local;
  int top_local;
  int left_local;
  Am_Drawonable_Impl *this_local;
  
  i_height._3_1_ = draw_monochrome;
  _i_width = image;
  image_local._0_4_ = height;
  image_local._4_4_ = width;
  height_local = top;
  width_local = left;
  _top_local = this;
  value = Am_Image_Array::operator_cast_to_Am_Wrapper_(image);
  this_00 = Am_Image_Array_Data::Narrow(value);
  if (this_00 != (Am_Image_Array_Data *)0x0) {
    PVar3 = Am_Image_Array_Data::Get_X_Pixmap(this_00,this);
    if (image_local._4_4_ < 0) {
      (*(this->super_Am_Drawonable)._vptr_Am_Drawonable[0x16])
                (this,_i_width,&local_38,(long)&image_data + 4);
    }
    else {
      local_38 = image_local._4_4_;
      image_data._4_4_ = (int)image_local;
    }
    iVar2 = Am_Image_Array_Data::Get_Depth(this_00);
    if (iVar2 < 2) {
      bVar1 = Am_Style::Valid(fs);
      if (bVar1) {
        set_gc_using_fill(this,fs,f,0);
        XFillRectangle(this->screen->display,this->xlib_drawable,this->screen->gc,width_local,
                       height_local,local_38,image_data._4_4_);
      }
      bVar1 = Am_Style::Valid(ls);
      if (bVar1) {
        set_gc_using_fill(this,ls,f,PVar3);
        XSetTSOrigin(this->screen->display,this->screen->gc,width_local,height_local);
        XFillRectangle(this->screen->display,this->xlib_drawable,this->screen->gc,width_local,
                       height_local,local_38,image_data._4_4_);
      }
    }
    else if (f == Am_DRAW_MASK_COPY) {
      bVar1 = Am_Style::Valid(fs);
      if (bVar1) {
        set_gc_using_fill(this,fs,Am_DRAW_MASK_COPY,0);
        XFillRectangle(this->screen->display,this->xlib_drawable,this->screen->gc,width_local,
                       height_local,local_38,image_data._4_4_);
      }
      else {
        PVar3 = Am_Image_Array_Data::Get_X_Mask(this_00,this,false);
        set_gc_using_fill(this,ls,Am_DRAW_MASK_COPY,PVar3);
        XSetTSOrigin(this->screen->display,this->screen->gc,width_local,height_local);
        XFillRectangle(this->screen->display,this->xlib_drawable,this->screen->gc,width_local,
                       height_local,local_38,image_data._4_4_);
      }
    }
    else if ((i_height._3_1_ & 1) == 0) {
      bVar1 = Am_Image_Array_Data::Is_Transparent(this_00);
      if (bVar1) {
        image_00 = Am_Image_Array_Data::Get_X_Mask(this_00,this,false);
        XSetTSOrigin(this->screen->display,this->screen->gc,width_local,height_local);
        bVar1 = Am_Style::Valid(fs);
        if (bVar1) {
          set_gc_using_fill(this,fs,f,0);
          XFillRectangle(this->screen->display,this->xlib_drawable,this->screen->gc,width_local,
                         height_local,local_38,image_data._4_4_);
        }
        set_gc_using_fill(this,&Am_On_Bits,Am_DRAW_GRAPHIC_OR,image_00);
        XSetTSOrigin(this->screen->display,this->screen->gc,width_local,height_local);
        XFillRectangle(this->screen->display,this->xlib_drawable,this->screen->gc,width_local,
                       height_local,local_38,image_data._4_4_);
        set_gc_using_fill(this,&Am_No_Style,Am_DRAW_GRAPHIC_AND,0);
        XCopyArea(this->screen->display,PVar3,this->xlib_drawable,this->screen->gc,0,0,local_38,
                  image_data._4_4_,width_local,height_local);
      }
      else {
        set_gc_using_fill(this,&Am_No_Style,f,0);
        XCopyArea(this->screen->display,PVar3,this->xlib_drawable,this->screen->gc,0,0,local_38,
                  image_data._4_4_,width_local,height_local);
      }
    }
    else {
      bVar1 = Am_Style::Valid(ls);
      if (bVar1) {
        PVar3 = Am_Image_Array_Data::Get_X_Mask(this_00,this,false);
        XSetTSOrigin(this->screen->display,this->screen->gc,width_local,height_local);
        bVar1 = Am_Style::Valid(fs);
        if (bVar1) {
          set_gc_using_fill(this,fs,f,0);
          XFillRectangle(this->screen->display,this->xlib_drawable,this->screen->gc,width_local,
                         height_local,local_38,image_data._4_4_);
        }
        set_gc_using_fill(this,ls,f,PVar3);
        XFillRectangle(this->screen->display,this->xlib_drawable,this->screen->gc,width_local,
                       height_local,local_38,image_data._4_4_);
      }
      else {
        bVar1 = Am_Style::Valid(fs);
        if (bVar1) {
          PVar3 = Am_Image_Array_Data::Get_X_Mask(this_00,this,true);
          XSetTSOrigin(this->screen->display,this->screen->gc,width_local,height_local);
          set_gc_using_fill(this,fs,f,PVar3);
          XFillRectangle(this->screen->display,this->xlib_drawable,this->screen->gc,width_local,
                         height_local,local_38,image_data._4_4_);
        }
      }
    }
  }
  return;
}

Assistant:

void
Am_Drawonable_Impl::Draw_Image(
    int left, int top, int width, int height, const Am_Image_Array &image,
    int i_left, int i_top,
    const Am_Style &ls,   // color of 'on' bits
    const Am_Style &fs,   // background behind image
    bool draw_monochrome, // use ls and fs in place of colors
    Am_Draw_Function f)
{
  int i_width, i_height;

  Am_Image_Array_Data *image_data = Am_Image_Array_Data::Narrow(image);
  if (!image_data) {
    return;
  }

  Pixmap pixmap = image_data->Get_X_Pixmap(this);

  if (width < 0) {
    Get_Image_Size(image, i_width, i_height);
  } else {
    i_width = width;
    i_height = height;
  }

  int depth = image_data->Get_Depth();
  if (depth > 1) {
    if (f == Am_DRAW_MASK_COPY) {
      if (fs.Valid()) {
        set_gc_using_fill(fs, f);
        XFillRectangle(screen->display, xlib_drawable, screen->gc, left, top,
                       i_width, i_height);
      } else {
        Pixmap mask = image_data->Get_X_Mask(this);
        set_gc_using_fill(ls, f, mask);
        XSetTSOrigin(screen->display, screen->gc, left, top);
        XFillRectangle(screen->display, xlib_drawable, screen->gc, left, top,
                       i_width, i_height);
      }
    } else {
      if (draw_monochrome) {
        if (ls.Valid()) {
          Pixmap mask = image_data->Get_X_Mask(this);

          XSetTSOrigin(screen->display, screen->gc, left, top);
          if (fs.Valid()) {
            set_gc_using_fill(fs, f);
            XFillRectangle(screen->display, xlib_drawable, screen->gc, left,
                           top, i_width, i_height);
          }

          set_gc_using_fill(ls, f, mask);
          XFillRectangle(screen->display, xlib_drawable, screen->gc, left, top,
                         i_width, i_height);
        } else if (fs.Valid()) {
          // foreground transparent; background not transparent
          // use inverted mask
          Pixmap mask = image_data->Get_X_Mask(this, true);

          XSetTSOrigin(screen->display, screen->gc, left, top);
          set_gc_using_fill(fs, f, mask);
          XFillRectangle(screen->display, xlib_drawable, screen->gc, left, top,
                         i_width, i_height);
        }
      } else if (image_data->Is_Transparent()) {
        Pixmap mask = image_data->Get_X_Mask(this);
        XSetTSOrigin(screen->display, screen->gc, left, top);

        if (fs.Valid()) { // use fs to fill background
          set_gc_using_fill(fs, f);
          XFillRectangle(screen->display, xlib_drawable, screen->gc, left, top,
                         i_width, i_height);
        }

        set_gc_using_fill(Am_On_Bits, Am_DRAW_GRAPHIC_OR, mask);
        XSetTSOrigin(screen->display, screen->gc, left, top);
        XFillRectangle(screen->display, xlib_drawable, screen->gc, left, top,
                       i_width, i_height);

        set_gc_using_fill(Am_No_Style, Am_DRAW_GRAPHIC_AND);
        XCopyArea(screen->display, pixmap, xlib_drawable, screen->gc, 0, 0,
                  i_width, i_height, left, top);
      } else { // opaque
        set_gc_using_fill(Am_No_Style, f);
        XCopyArea(screen->display, pixmap, xlib_drawable, screen->gc, 0, 0,
                  i_width, i_height, left, top);
      }
    }
  } else { // bitmap (depth == 1), might be transparent.
    // The idea of transparent and opaque bitmaps is implemented here, but it
    // is not through the fill-flag of any style object.  The way to make a
    // bitmap transparent is to just not pass any fill-style.  If a fill-style
    // is passed, the bitmap will be opaque (i.e., the 'off' bits will be
    // drawn with the color of the fill-style).
    // 4-18-97 eab
    // I have left old behavior in place for bitmaps
    // draw_monochrome requires masking that I haven't been able to get
    // working for bitmaps (xbm files, nameless images)
    // I may be mistaken, but it appears that some nameless images of
    // depth 1 may be stored one pixel per byte and others one pixel
    // per bit!!!
    if (fs.Valid()) {
      set_gc_using_fill(fs, f);
      XFillRectangle(screen->display, xlib_drawable, screen->gc, left, top,
                     i_width, i_height);
    }

    if (ls.Valid()) {
      set_gc_using_fill(ls, f, pixmap);
      XSetTSOrigin(screen->display, screen->gc, left, top);
      XFillRectangle(screen->display, xlib_drawable, screen->gc, left, top,
                     i_width, i_height);
    }
  }
}